

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void fs_listdir_fileinfo(char *dir,FS_LISTDIR_CALLBACK_FILEINFO cb,int type,void *user)

{
  char *src;
  int iVar1;
  DIR *__dirp;
  size_t sVar2;
  dirent *pdVar3;
  __time_t _Var4;
  __time_t _Var5;
  long in_FS_OFFSET;
  bool bVar6;
  CFsFileInfo info;
  char buffer [512];
  stat sb;
  CFsFileInfo local_2e0;
  char local_2c8 [512];
  stat local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __dirp = opendir(dir);
  if (__dirp != (DIR *)0x0) {
    str_format(local_2c8,0x200,"%s/",dir);
    sVar2 = strlen(local_2c8);
    _Var4 = -1;
    _Var5 = -1;
    do {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      src = pdVar3->d_name;
      str_copy(local_2c8 + (int)sVar2,src,0x200 - (int)sVar2);
      iVar1 = stat(local_2c8,&local_c8);
      if (iVar1 == 0) {
        _Var4 = local_c8.st_ctim.tv_sec;
        _Var5 = local_c8.st_mtim.tv_sec;
      }
      local_2e0.m_pName = src;
      local_2e0.m_TimeCreated = _Var4;
      local_2e0.m_TimeModified = _Var5;
      if (pdVar3->d_type == '\0') {
        iVar1 = stat(local_2c8,&local_c8);
        bVar6 = (local_c8.st_mode & 0xf000) == 0x4000 && iVar1 != -1;
      }
      else {
        bVar6 = pdVar3->d_type == '\x04';
      }
      iVar1 = (*cb)(&local_2e0,SUB14(bVar6,0),type,user);
    } while (iVar1 == 0);
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void fs_listdir_fileinfo(const char *dir, FS_LISTDIR_CALLBACK_FILEINFO cb, int type, void *user)
{
#if defined(CONF_FAMILY_WINDOWS)
	WIN32_FIND_DATAW finddata;
	HANDLE handle;
	char buffer[IO_MAX_PATH_LENGTH];
	char buffer2[IO_MAX_PATH_LENGTH];
	WCHAR wBuffer[IO_MAX_PATH_LENGTH];
	int length;

	str_format(buffer, sizeof(buffer), "%s/*", dir);
	MultiByteToWideChar(CP_UTF8, 0, buffer, -1, wBuffer, sizeof(wBuffer) / sizeof(WCHAR));

	handle = FindFirstFileW(wBuffer, &finddata);
	if(handle == INVALID_HANDLE_VALUE)
		return;

	str_format(buffer, sizeof(buffer), "%s/", dir);
	length = str_length(buffer);

	/* add all the entries */
	do
	{
		WideCharToMultiByte(CP_UTF8, 0, finddata.cFileName, -1, buffer2, sizeof(buffer2), NULL, NULL);
		str_copy(buffer+length, buffer2, (int)sizeof(buffer)-length);

		CFsFileInfo info;
		info.m_pName = buffer2;
		info.m_TimeCreated = filetime_to_unixtime(&finddata.ftCreationTime);
		info.m_TimeModified = filetime_to_unixtime(&finddata.ftLastWriteTime);

		if(cb(&info, (finddata.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0, type, user))
			break;
	}
	while(FindNextFileW(handle, &finddata));

	FindClose(handle);
#else
	struct dirent *entry;
	time_t created = -1, modified = -1;
	char buffer[IO_MAX_PATH_LENGTH];
	int length;
	DIR *d = opendir(dir);

	if(!d)
		return;

	str_format(buffer, sizeof(buffer), "%s/", dir);
	length = str_length(buffer);

	while((entry = readdir(d)) != NULL)
	{
		CFsFileInfo info;

		str_copy(buffer+length, entry->d_name, (int)sizeof(buffer)-length);
		fs_file_time(buffer, &created, &modified);

		info.m_pName = entry->d_name;
		info.m_TimeCreated = created;
		info.m_TimeModified = modified;

		if(cb(&info, entry->d_type == DT_UNKNOWN ? fs_is_dir(buffer) : entry->d_type == DT_DIR, type, user))
			break;
	}

	/* close the directory and return */
	closedir(d);
#endif
}